

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

bool __thiscall absl::lts_20250127::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  bool bVar1;
  SynchEvent *pSVar2;
  bool bVar3;
  char *pcVar4;
  undefined1 *puVar5;
  SynchWaitParams waitp;
  SynchWaitParams local_68;
  
  AssertReaderHeld(this);
  bVar1 = (*cond->eval_)(cond);
  bVar3 = true;
  if (!bVar1) {
    puVar5 = kExclusiveS;
    if (((this->mu_).super___atomic_base<long>._M_i & 8U) == 0) {
      puVar5 = kSharedS;
    }
    local_68.thread = &base_internal::CurrentThreadIdentityIfPresent()->per_thread_synch;
    if ((ThreadIdentity *)local_68.thread == (ThreadIdentity *)0x0) {
      local_68.thread = &synchronization_internal::CreateThreadIdentity()->per_thread_synch;
    }
    local_68.cvmu = (Mutex *)0x0;
    local_68.cv_word = (atomic<long> *)0x0;
    local_68.how = (MuHow)puVar5;
    local_68.cond = cond;
    local_68.timeout.rep_ = t.rep_;
    if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
      local_68.contention_start_cycles = rdtsc();
    }
    else {
      local_68.contention_start_cycles = (*base_internal::CycleClock::cycle_clock_source_)();
    }
    local_68.contention_start_cycles = local_68.contention_start_cycles >> 2;
    local_68.should_submit_contention_data = false;
    UnlockSlow(this,&local_68);
    Block(this,local_68.thread);
    LockSlowLoop(this,&local_68,3);
    bVar3 = true;
    if (local_68.cond == (Condition *)0x0) {
      bVar1 = (*cond->eval_)(cond);
      if (!bVar1) {
        if (t.rep_ == 0xffffffffffffffff) {
          AwaitCommon();
          if ((*(ulong *)cond->callback_ & 9) != 0) {
            return SUB81(*(ulong *)cond->callback_,0);
          }
          pSVar2 = GetSynchEvent(cond);
          pcVar4 = "";
          if (pSVar2 != (SynchEvent *)0x0) {
            pcVar4 = pSVar2->name;
          }
          raw_log_internal::RawLog
                    (kFatal,"mutex.cc",0x9cd,
                     "thread should hold at least a read lock on Mutex %p %s",cond,pcVar4,t.rep_);
          __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/synchronization/mutex.cc"
                        ,0x9cd,"void absl::Mutex::AssertReaderHeld() const");
        }
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool Mutex::AwaitCommon(const Condition& cond, KernelTimeout t) {
  if (kDebugMode) {
    this->AssertReaderHeld();
  }
  if (cond.Eval()) {  // condition already true; nothing to do
    return true;
  }
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(how, &cond, t, nullptr /*no cvmu*/,
                        Synch_GetPerThreadAnnotated(this),
                        nullptr /*no cv_word*/);
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, kMuHasBlocked | kMuIsCond);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  ABSL_RAW_CHECK(res || t.has_timeout(),
                 "condition untrue on return from Await");
  return res;
}